

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Job::GetCommandString_abi_cxx11_(string *__return_storage_ptr__,Job *this)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  ostringstream command;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (this->mExpr).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->mExpr).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1 + -1;
      pbVar3 = pbVar3 + 1) {
    poVar2 = std::operator<<((ostream *)local_1a0,(string *)pbVar3);
    std::operator<<(poVar2," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::pop_back();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Job::GetCommandString()
{
    std::ostringstream command;
    std::string        out;

    for_each(mExpr.begin(), mExpr.end() - 1, [&command](std::string &item) { command << item << " "; });
    out = command.str();
    out.pop_back(); // get rid of trailing space
    return out;
}